

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeRowTrigger
               (Parse *pParse,Trigger *pTrigger,int op,ExprList *pChanges,int tr_tm,Table *pTab,
               int reg,int orconf,int ignoreJump)

{
  undefined1 *puVar1;
  sqlite3 *db;
  Vdbe *p;
  Returning *pRVar2;
  ExprList *pEVar3;
  sqlite3 *db_00;
  char cVar4;
  int iVar5;
  Expr *pEVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ExprList_item *pEVar11;
  int p1;
  long lVar12;
  long in_FS_OFFSET;
  SrcList sFrom;
  Select sSelect;
  ExprList *local_198;
  NameContext local_148;
  undefined1 *local_108;
  char *pcStack_100;
  undefined1 *local_f8;
  Table *pTStack_f0;
  undefined8 local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  ExprList *local_98;
  SrcList *pSStack_90;
  Expr *local_88;
  ExprList *pEStack_80;
  Expr *local_78;
  ExprList *pEStack_70;
  Select *local_68;
  Select *pSStack_60;
  Expr *local_58;
  With *pWStack_50;
  Window *local_48;
  Window *pWStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pTrigger != (Trigger *)0x0) {
    do {
      if ((((uint)pTrigger->op == op) && ((uint)pTrigger->tr_tm == tr_tm)) &&
         (iVar5 = checkColumnOverlap(pTrigger->pColumns,pChanges), iVar5 != 0)) {
        if (pTrigger->bReturning == '\0') {
          sqlite3CodeRowTriggerDirect(pParse,pTrigger,pTab,reg,orconf,ignoreJump);
        }
        else if (pParse->pToplevel == (Parse *)0x0) {
          db = pParse->db;
          p = pParse->pVdbe;
          local_48 = (Window *)&DAT_aaaaaaaaaaaaaaaa;
          pWStack_40 = (Window *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
          pWStack_50 = (With *)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
          pSStack_60 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
          local_78 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
          pEStack_70 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          local_88 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
          pEStack_80 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          local_98 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          pSStack_90 = (SrcList *)&DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_f8 = &DAT_aaaaaaaaaaaaaaaa;
          pTStack_f0 = (Table *)&DAT_aaaaaaaaaaaaaaaa;
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          pcStack_100 = &DAT_aaaaaaaaaaaaaaaa;
          if ((pParse->bReturning != '\0') &&
             (pRVar2 = (pParse->u1).pReturning, &pRVar2->retTrig == pTrigger)) {
            local_48 = (Window *)0x0;
            pWStack_40 = (Window *)0x0;
            local_58 = (Expr *)0x0;
            pWStack_50 = (With *)0x0;
            local_68 = (Select *)0x0;
            pSStack_60 = (Select *)0x0;
            local_78 = (Expr *)0x0;
            pEStack_70 = (ExprList *)0x0;
            local_88 = (Expr *)0x0;
            pEStack_80 = (ExprList *)0x0;
            local_98 = (ExprList *)0x0;
            pSStack_90 = (SrcList *)0x0;
            local_a8 = (undefined1 *)0x0;
            puStack_a0 = (undefined1 *)0x0;
            local_b8 = (undefined1 *)0x0;
            puStack_b0 = (undefined1 *)0x0;
            local_108 = (undefined1 *)0x0;
            pcStack_100 = (char *)0x0;
            local_f8 = (undefined1 *)0x0;
            pTStack_f0 = (Table *)0x0;
            local_e8 = (undefined1 *)0x0;
            puStack_e0 = (undefined1 *)0x0;
            local_d8 = (undefined1 *)0x0;
            puStack_d0 = (undefined1 *)0x0;
            local_c8 = (undefined1 *)0x0;
            puStack_c0 = (undefined1 *)0x0;
            local_98 = sqlite3ExprListDup(db,pRVar2->pReturnEL,0);
            pSStack_90 = (SrcList *)&local_108;
            local_108 = (undefined1 *)CONCAT44(local_108._4_4_,1);
            pcStack_100 = pTab->zName;
            local_e8 = (undefined1 *)CONCAT44(0xffffffff,(undefined4)local_e8);
            pTStack_f0 = pTab;
            sqlite3SelectPrep(pParse,(Select *)&local_b8,(NameContext *)0x0);
            if (pParse->nErr == 0) {
              sqlite3GenerateColumnNames(pParse,(Select *)&local_b8);
            }
            if (local_98 != (ExprList *)0x0) {
              exprListDeleteNN(db,local_98);
            }
            pEVar3 = pRVar2->pReturnEL;
            if (pEVar3->nExpr < 1) {
              local_198 = (ExprList *)0x0;
            }
            else {
              db_00 = pParse->db;
              lVar9 = 0;
              local_198 = (ExprList *)0x0;
              do {
                pEVar6 = pEVar3->a[lVar9].pExpr;
                if (pEVar6 != (Expr *)0x0) {
                  if (pEVar6->op != 0xb4) {
                    if ((pEVar6->op != 0x8e) || (pEVar6->pRight->op != 0xb4)) {
                      pEVar6 = exprDup(db_00,pEVar6,0,(EdupBuf *)0x0);
                      local_198 = sqlite3ExprListAppend(pParse,local_198,pEVar6);
                      if ((db_00->mallocFailed == '\0') &&
                         (pcVar7 = pEVar3->a[lVar9].zEName, pcVar7 != (char *)0x0)) {
                        lVar10 = (long)local_198->nExpr;
                        pcVar7 = sqlite3DbStrDup(db_00,pcVar7);
                        local_198->a[lVar10 + -1].zEName = pcVar7;
                        *(ushort *)&local_198->a[lVar10 + -1].fg.field_0x1 =
                             *(ushort *)&local_198->a[lVar10 + -1].fg.field_0x1 & 0xfffc |
                             *(ushort *)&pEVar3->a[lVar9].fg.field_0x1 & 3;
                      }
                      goto LAB_001a565e;
                    }
                    sqlite3ErrorMsg(pParse,"RETURNING may not use \"TABLE.*\" wildcards");
                  }
                  if (0 < pTab->nCol) {
                    lVar12 = 0;
                    lVar10 = 0;
                    do {
                      if ((*(byte *)((long)&pTab->aCol->colFlags + lVar12) & 2) == 0) {
                        pEVar6 = sqlite3Expr(db_00,0x3c,
                                             *(char **)((long)&pTab->aCol->zCnName + lVar12));
                        local_198 = sqlite3ExprListAppend(pParse,local_198,pEVar6);
                        if (db_00->mallocFailed == '\0') {
                          iVar5 = local_198->nExpr;
                          pcVar7 = sqlite3DbStrDup(db_00,*(char **)((long)&pTab->aCol->zCnName +
                                                                   lVar12));
                          local_198->a[(long)iVar5 + -1].zEName = pcVar7;
                          puVar1 = &local_198->a[(long)iVar5 + -1].fg.field_0x1;
                          *puVar1 = *puVar1 & 0xfc;
                        }
                      }
                      lVar10 = lVar10 + 1;
                      lVar12 = lVar12 + 0x10;
                    } while (lVar10 < pTab->nCol);
                  }
                }
LAB_001a565e:
                lVar9 = lVar9 + 1;
              } while (lVar9 < pEVar3->nExpr);
            }
            if (pParse->nErr == 0) {
              local_148.pSrcList = (SrcList *)0x0;
              local_148.pNext = (NameContext *)0x0;
              local_148.nRef = 0;
              local_148.nNcErr = 0;
              local_148.pWinSelect = (Select *)0x0;
              if (pRVar2->nRetCol == 0) {
                pRVar2->nRetCol = local_198->nExpr;
                iVar5 = pParse->nTab;
                pParse->nTab = iVar5 + 1;
                pRVar2->iRetCur = iVar5;
              }
              local_148.uNC._4_4_ = 0;
              local_148.uNC.iBaseReg = reg;
              local_148.ncFlags = 0x400;
              local_148.nNestedSelect = 0;
              pParse->eTriggerOp = pTrigger->op;
              pParse->pTriggerTab = pTab;
              local_148.pParse = pParse;
              iVar5 = sqlite3ResolveExprListNames(&local_148,local_198);
              if ((iVar5 == 0) && (db->mallocFailed == '\0')) {
                iVar5 = local_198->nExpr;
                p1 = pParse->nMem + 1;
                sqlite3ProcessReturningSubqueries(local_198,pTab);
                pParse->nMem = pParse->nMem + iVar5 + 2;
                pRVar2->iRetReg = p1;
                if ((long)iVar5 < 1) {
                  lVar9 = 0;
                }
                else {
                  pEVar11 = local_198->a;
                  lVar9 = 0;
                  do {
                    pEVar6 = pEVar11->pExpr;
                    iVar8 = p1 + (int)lVar9;
                    sqlite3ExprCodeFactorable(pParse,pEVar6,iVar8);
                    cVar4 = sqlite3ExprAffinity(pEVar6);
                    if (cVar4 == 'E') {
                      sqlite3VdbeAddOp3(p,0x57,iVar8,0,0);
                    }
                    lVar9 = lVar9 + 1;
                    pEVar11 = pEVar11 + 1;
                  } while (iVar5 != lVar9);
                }
                iVar5 = (int)lVar9;
                sqlite3VdbeAddOp3(p,0x61,p1,iVar5,p1 + iVar5);
                iVar8 = iVar5 + p1 + 1;
                sqlite3VdbeAddOp3(p,0x7f,pRVar2->iRetCur,iVar8,0);
                sqlite3VdbeAddOp3(p,0x80,pRVar2->iRetCur,p1 + iVar5,iVar8);
              }
            }
            if (local_198 != (ExprList *)0x0) {
              exprListDeleteNN(db,local_198);
            }
            pParse->eTriggerOp = '\0';
            pParse->pTriggerTab = (Table *)0x0;
          }
        }
      }
      pTrigger = pTrigger->pNext;
    } while (pTrigger != (Trigger *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTrigger(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  int op,              /* One of TK_UPDATE, TK_INSERT, TK_DELETE */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int tr_tm,           /* One of TRIGGER_BEFORE, TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* The first in an array of registers (see above) */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Trigger *p;          /* Used to iterate through pTrigger list */

  assert( op==TK_UPDATE || op==TK_INSERT || op==TK_DELETE );
  assert( tr_tm==TRIGGER_BEFORE || tr_tm==TRIGGER_AFTER );
  assert( (op==TK_UPDATE)==(pChanges!=0) );

  for(p=pTrigger; p; p=p->pNext){

    /* Sanity checking:  The schema for the trigger and for the table are
    ** always defined.  The trigger must be in the same schema as the table
    ** or else it must be a TEMP trigger. */
    assert( p->pSchema!=0 );
    assert( p->pTabSchema!=0 );
    assert( p->pSchema==p->pTabSchema
         || p->pSchema==pParse->db->aDb[1].pSchema );

    /* Determine whether we should code this trigger.  One of two choices:
    **   1. The trigger is an exact match to the current DML statement
    **   2. This is a RETURNING trigger for INSERT but we are currently
    **      doing the UPDATE part of an UPSERT.
    */
    if( (p->op==op || (p->bReturning && p->op==TK_INSERT && op==TK_UPDATE))
     && p->tr_tm==tr_tm
     && checkColumnOverlap(p->pColumns, pChanges)
    ){
      if( !p->bReturning ){
        sqlite3CodeRowTriggerDirect(pParse, p, pTab, reg, orconf, ignoreJump);
      }else if( sqlite3IsToplevel(pParse) ){
        codeReturningTrigger(pParse, p, pTab, reg);
      }
    }
  }
}